

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.cpp
# Opt level: O0

SerializationCompatibility * duckdb::SerializationCompatibility::FromIndex(idx_t version)

{
  idx_t in_RSI;
  SerializationCompatibility *in_RDI;
  SerializationCompatibility *result;
  
  SerializationCompatibility((SerializationCompatibility *)0x87ded4);
  ::std::__cxx11::string::operator=((string *)in_RDI,anon_var_dwarf_3eb64fd + 9);
  in_RDI->serialization_version = in_RSI;
  in_RDI->manually_set = false;
  return in_RDI;
}

Assistant:

SerializationCompatibility SerializationCompatibility::FromIndex(const idx_t version) {
	SerializationCompatibility result;
	result.duckdb_version = "";
	result.serialization_version = version;
	result.manually_set = false;
	return result;
}